

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

unique_ptr<MCTS::Node<TestGame>,_std::default_delete<MCTS::Node<TestGame>_>_>
MCTS::compute_tree<TestGame>(TestGame root_state,ComputeOptions options,result_type initial_seed)

{
  bool bVar1;
  runtime_error *this;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *this_00;
  int in_EDX;
  undefined8 in_RSI;
  tuple<MCTS::Node<TestGame>_*,_std::default_delete<MCTS::Node<TestGame>_>_> in_RDI;
  int in_stack_0000000c;
  double in_stack_00000010;
  Move move;
  pointer node;
  int iter;
  TestGame state;
  mt19937_64 random_engine;
  unique_ptr<MCTS::Node<TestGame>,_std::default_delete<MCTS::Node<TestGame>_>_> *root;
  undefined4 in_stack_fffffffffffff578;
  Move in_stack_fffffffffffff57c;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff580;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff588;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff590;
  Move in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff59c;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff5a0;
  bool local_a53;
  _Head_base<0UL,_MCTS::Node<TestGame>_*,_false> this_01;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int in_stack_fffffffffffff7d4;
  char *in_stack_fffffffffffff7d8;
  char *in_stack_fffffffffffff7e0;
  int local_14;
  
  this_01._M_head_impl =
       (Node<TestGame> *)
       in_RDI.
       super__Tuple_impl<0UL,_MCTS::Node<TestGame>_*,_std::default_delete<MCTS::Node<TestGame>_>_>.
       super__Head_base<0UL,_MCTS::Node<TestGame>_*,_false>._M_head_impl;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            (in_stack_fffffffffffff580,CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578)
            );
  if ((in_stack_0000000c < 0) && (in_stack_00000010 < 0.0)) {
    assertion_failed(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4);
  }
  if (in_stack_00000010 < 0.0) {
    local_14 = (int)in_RSI;
    if ((local_14 != 1) && (local_14 != 2)) {
      assertion_failed(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d4
                      );
    }
    operator_new(0x60);
    Node<TestGame>::Node
              ((Node<TestGame> *)in_stack_fffffffffffff580,
               (TestGame *)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578));
    std::unique_ptr<MCTS::Node<TestGame>,std::default_delete<MCTS::Node<TestGame>>>::
    unique_ptr<std::default_delete<MCTS::Node<TestGame>>,void>
              ((unique_ptr<MCTS::Node<TestGame>,_std::default_delete<MCTS::Node<TestGame>_>_> *)
               in_stack_fffffffffffff580,
               (pointer)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578));
    TestGame::TestGame((TestGame *)&stack0xfffffffffffff5ec,2);
    for (iVar3 = 1; iVar3 <= in_stack_0000000c || in_stack_0000000c < 0; iVar3 = iVar3 + 1) {
      this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                 *)std::
                   unique_ptr<MCTS::Node<TestGame>,_std::default_delete<MCTS::Node<TestGame>_>_>::
                   get((unique_ptr<MCTS::Node<TestGame>,_std::default_delete<MCTS::Node<TestGame>_>_>
                        *)in_stack_fffffffffffff580);
      iVar5 = (int)((ulong)in_RSI >> 0x20);
      iVar4 = local_14;
      iVar6 = in_EDX;
      while( true ) {
        bVar1 = Node<TestGame>::has_untried_moves((Node<TestGame> *)0x1d62ec);
        local_a53 = false;
        if (!bVar1) {
          local_a53 = Node<TestGame>::has_children((Node<TestGame> *)0x1d630d);
        }
        if (local_a53 == false) break;
        in_stack_fffffffffffff5a0 =
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)Node<TestGame>::select_child_UCT(this_01._M_head_impl);
        this_00 = in_stack_fffffffffffff5a0;
        TestGame::do_move((TestGame *)in_stack_fffffffffffff580,in_stack_fffffffffffff57c);
      }
      bVar1 = Node<TestGame>::has_untried_moves((Node<TestGame> *)0x1d63a7);
      in_stack_fffffffffffff59c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff59c);
      if (bVar1) {
        in_stack_fffffffffffff598 =
             Node<TestGame>::
             get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                       ((Node<TestGame> *)in_stack_fffffffffffff5a0,
                        (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                         *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
        TestGame::do_move((TestGame *)in_stack_fffffffffffff580,in_stack_fffffffffffff57c);
        in_stack_fffffffffffff590 =
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)Node<TestGame>::add_child
                          ((Node<TestGame> *)CONCAT44(iVar6,iVar5),(Move *)CONCAT44(iVar4,iVar3),
                           (TestGame *)this_00);
        this_00 = in_stack_fffffffffffff590;
      }
      while (bVar1 = TestGame::has_moves((TestGame *)&stack0xfffffffffffff5ec), bVar1) {
        TestGame::
        do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                  ((TestGame *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
      }
      while (this_00 !=
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)0x0) {
        pmVar2 = this_00;
        in_stack_fffffffffffff588 =
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)TestGame::get_result
                          ((TestGame *)in_stack_fffffffffffff588,(int)((ulong)this_00 >> 0x20));
        Node<TestGame>::update((Node<TestGame> *)this_00,(double)in_stack_fffffffffffff588);
        in_stack_fffffffffffff580 = this_00;
        this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                   *)pmVar2->_M_x[1];
      }
    }
    return (__uniq_ptr_data<MCTS::Node<TestGame>,_std::default_delete<MCTS::Node<TestGame>_>,_true,_true>
            )(__uniq_ptr_data<MCTS::Node<TestGame>,_std::default_delete<MCTS::Node<TestGame>_>,_true,_true>
              )in_RDI.
               super__Tuple_impl<0UL,_MCTS::Node<TestGame>_*,_std::default_delete<MCTS::Node<TestGame>_>_>
               .super__Head_base<0UL,_MCTS::Node<TestGame>_*,_false>._M_head_impl;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"ComputeOptions::max_time requires OpenMP.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}